

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::Arg::commands_abi_cxx11_
          (string *__return_storage_ptr__,Arg *this)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  ostringstream oss;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar4 = (this->super_OptionArgProperties).shortNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_OptionArgProperties).shortNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar1) {
    if ((this->super_OptionArgProperties).longName._M_string_length == 0) goto LAB_0017fb20;
  }
  else {
    bVar2 = true;
    do {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
    if ((this->super_OptionArgProperties).longName._M_string_length == 0) goto LAB_0017fb20;
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"--",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(this->super_OptionArgProperties).longName._M_dataplus._M_p,
             (this->super_OptionArgProperties).longName._M_string_length);
LAB_0017fb20:
  if ((this->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," <",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (this->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_dataplus
                        ._M_p,(this->super_CommonArgProperties<Catch::ConfigData>).placeholder.
                              _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string commands() const {
                std::ostringstream oss;
                bool first = true;
                std::vector<std::string>::const_iterator it = shortNames.begin(), itEnd = shortNames.end();
                for(; it != itEnd; ++it ) {
                    if( first )
                        first = false;
                    else
                        oss << ", ";
                    oss << "-" << *it;
                }
                if( !longName.empty() ) {
                    if( !first )
                        oss << ", ";
                    oss << "--" << longName;
                }
                if( !placeholder.empty() )
                    oss << " <" << placeholder << ">";
                return oss.str();
            }